

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  int i;
  int iVar3;
  ImGuiWindow *window_local;
  
  window_local = window;
  ImVector<ImGuiWindow_*>::push_back(out_sorted_windows,&window_local);
  if (window_local->Active == true) {
    iVar1 = (window_local->DC).ChildWindows.Size;
    ImQsort((window_local->DC).ChildWindows.Data,(long)iVar1,8,ChildWindowComparer);
    i = 0;
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    for (; iVar3 != i; i = i + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(window_local->DC).ChildWindows,i);
      if ((*ppIVar2)->Active == true) {
        AddWindowToSortBuffer(out_sorted_windows,*ppIVar2);
      }
    }
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        ImQsort(window->DC.ChildWindows.Data, (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}